

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001b0000 = 0x2e2e2e2e2e2e2e;
    uRam00000000001b0007._0_1_ = '.';
    uRam00000000001b0007._1_1_ = '.';
    uRam00000000001b0007._2_1_ = '.';
    uRam00000000001b0007._3_1_ = '.';
    uRam00000000001b0007._4_1_ = '.';
    uRam00000000001b0007._5_1_ = '.';
    uRam00000000001b0007._6_1_ = '.';
    uRam00000000001b0007._7_1_ = '.';
    DAT_001afff0 = '.';
    DAT_001afff0_1._0_1_ = '.';
    DAT_001afff0_1._1_1_ = '.';
    DAT_001afff0_1._2_1_ = '.';
    DAT_001afff0_1._3_1_ = '.';
    DAT_001afff0_1._4_1_ = '.';
    DAT_001afff0_1._5_1_ = '.';
    DAT_001afff0_1._6_1_ = '.';
    uRam00000000001afff8 = 0x2e2e2e2e2e2e2e;
    DAT_001affff = 0x2e;
    DAT_001affe0 = '.';
    DAT_001affe0_1._0_1_ = '.';
    DAT_001affe0_1._1_1_ = '.';
    DAT_001affe0_1._2_1_ = '.';
    DAT_001affe0_1._3_1_ = '.';
    DAT_001affe0_1._4_1_ = '.';
    DAT_001affe0_1._5_1_ = '.';
    DAT_001affe0_1._6_1_ = '.';
    uRam00000000001affe8._0_1_ = '.';
    uRam00000000001affe8._1_1_ = '.';
    uRam00000000001affe8._2_1_ = '.';
    uRam00000000001affe8._3_1_ = '.';
    uRam00000000001affe8._4_1_ = '.';
    uRam00000000001affe8._5_1_ = '.';
    uRam00000000001affe8._6_1_ = '.';
    uRam00000000001affe8._7_1_ = '.';
    DAT_001affd0 = '.';
    DAT_001affd0_1._0_1_ = '.';
    DAT_001affd0_1._1_1_ = '.';
    DAT_001affd0_1._2_1_ = '.';
    DAT_001affd0_1._3_1_ = '.';
    DAT_001affd0_1._4_1_ = '.';
    DAT_001affd0_1._5_1_ = '.';
    DAT_001affd0_1._6_1_ = '.';
    uRam00000000001affd8._0_1_ = '.';
    uRam00000000001affd8._1_1_ = '.';
    uRam00000000001affd8._2_1_ = '.';
    uRam00000000001affd8._3_1_ = '.';
    uRam00000000001affd8._4_1_ = '.';
    uRam00000000001affd8._5_1_ = '.';
    uRam00000000001affd8._6_1_ = '.';
    uRam00000000001affd8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001affc8._0_1_ = '.';
    uRam00000000001affc8._1_1_ = '.';
    uRam00000000001affc8._2_1_ = '.';
    uRam00000000001affc8._3_1_ = '.';
    uRam00000000001affc8._4_1_ = '.';
    uRam00000000001affc8._5_1_ = '.';
    uRam00000000001affc8._6_1_ = '.';
    uRam00000000001affc8._7_1_ = '.';
    DAT_001b000f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}